

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruapu.h
# Opt level: O2

void ruapu_init(void)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = 0;
  for (lVar3 = 8; lVar3 != 0x328; lVar3 = lVar3 + 0x10) {
    iVar1 = ruapu_detect_isa(*(ruapu_some_inst *)((long)&g_ruapu_isa_map[0].isa + lVar3));
    if (iVar1 != 0) {
      g_ruapu_isa_supported[lVar2] = *(char **)(lVar3 + 0x211858);
      lVar2 = lVar2 + 1;
    }
  }
  g_ruapu_isa_supported[lVar2] = (char *)0x0;
  return;
}

Assistant:

void ruapu_init()
{
#if defined _WIN32 || defined __ANDROID__ || defined __linux__ || defined __APPLE__ || defined __FreeBSD__ || defined __NetBSD__ || defined __OpenBSD__ || defined __DragonFly__ || defined __sun__ || defined __SYTERKIT__
    size_t j = 0;
    for (size_t i = 0; i < sizeof(g_ruapu_isa_map) / sizeof(g_ruapu_isa_map[0]); i++)
    {
        int capable = ruapu_detect_isa(g_ruapu_isa_map[i].inst);
        if (capable)
        {
            g_ruapu_isa_supported[j] = g_ruapu_isa_map[i].isa;
            j++;
        }
    }
    g_ruapu_isa_supported[j] = 0;
#elif defined __openrisc__
    ruapu_detect_openrisc_isa();
#else
    // initialize g_ruapu_isa_map for baremetal here, default all zero
    // there is still ruapu_some_XYZ() functions available
    // but you have to work out your own signal handling
#warning ruapu does not support your baremetal os yet
#endif
}